

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copyto.cpp
# Opt level: O2

int __thiscall
ncnn::CopyTo::forward
          (CopyTo *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *src;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  pointer __fn;
  Mat *self;
  size_t sVar6;
  int iVar7;
  undefined4 in_EAX;
  int iVar8;
  int *piVar9;
  long lVar10;
  int z;
  long lVar11;
  void *in_R8;
  int q;
  int q_1;
  undefined1 auVar12 [16];
  int _woffset;
  int _hoffset;
  Mat m;
  int _coffset;
  int _doffset;
  Mat m_1;
  
  __fn = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
         super__Vector_impl_data._M_start;
  src = __fn + 1;
  self = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
         super__Vector_impl_data._M_start;
  iVar5 = __fn->dims;
  sVar6 = __fn->elemsize;
  if (__fn[1].dims == iVar5) {
    uVar1 = __fn->w;
    uVar2 = __fn->h;
    uVar3 = __fn->d;
    uVar4 = __fn->c;
    auVar12._0_4_ = -(uint)(__fn[1].w == uVar1);
    auVar12._4_4_ = -(uint)(__fn[1].h == uVar2);
    auVar12._8_4_ = -(uint)(__fn[1].d == uVar3);
    auVar12._12_4_ = -(uint)(__fn[1].c == uVar4);
    iVar8 = movmskps(in_EAX,auVar12);
    if (iVar8 == 0xf) {
      if (self != src) {
        piVar9 = __fn[1].refcount;
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + 1;
          UNLOCK();
        }
        piVar9 = self->refcount;
        if (piVar9 != (int *)0x0) {
          LOCK();
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            if (self->allocator == (Allocator *)0x0) {
              free(self->data);
            }
            else {
              (*self->allocator->_vptr_Allocator[3])();
            }
          }
        }
        self->cstep = 0;
        self->data = (void *)0x0;
        self->refcount = (int *)0x0;
        *(undefined1 (*) [16])((long)&self->refcount + 4) = (undefined1  [16])0x0;
        self->c = 0;
        self->dims = 0;
        self->w = 0;
        self->h = 0;
        self->d = 0;
        piVar9 = __fn[1].refcount;
        self->data = __fn[1].data;
        self->refcount = piVar9;
        self->elemsize = __fn[1].elemsize;
        self->elempack = __fn[1].elempack;
        self->allocator = __fn[1].allocator;
        iVar5 = __fn[1].w;
        iVar8 = __fn[1].h;
        iVar7 = __fn[1].d;
        self->dims = __fn[1].dims;
        self->w = iVar5;
        self->h = iVar8;
        self->d = iVar7;
        self->c = __fn[1].c;
        self->cstep = __fn[1].cstep;
        return 0;
      }
      return 0;
    }
  }
  Mat::clone(&m,(__fn *)__fn,opt->blob_allocator,(int)opt,in_R8);
  piVar9 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (self != &m) {
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + 1;
      UNLOCK();
    }
    piVar9 = self->refcount;
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (self->allocator == (Allocator *)0x0) {
          free(self->data);
        }
        else {
          (*self->allocator->_vptr_Allocator[3])();
        }
      }
    }
    self->data = m.data;
    piVar9 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    self->refcount = piVar9;
    self->elemsize = m.elemsize;
    self->elempack = m.elempack;
    self->allocator = m.allocator;
    self->dims = m.dims;
    self->w = m.w;
    self->h = m.h;
    self->d = m.d;
    self->c = m.c;
    self->cstep = m.cstep;
  }
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (self->data == (void *)0x0) {
    return -100;
  }
  if ((long)self->c * self->cstep == 0) {
    return -100;
  }
  m.elempack = 1;
  switch(__fn->dims) {
  case 1:
    m.cstep = (long)__fn->elempack * (long)__fn->w;
    m.w = (int)m.cstep;
    m.h = 1;
    m.d = 1;
    m.c = 1;
    m.dims = m.elempack;
    break;
  case 2:
    m.w = __fn->w;
    lVar10 = (long)__fn->elempack * (long)__fn->h;
    m.dims = 2;
    m.h = (int)lVar10;
    m.d = 1;
    m.c = 1;
    m.cstep = lVar10 * m.w;
    break;
  case 3:
    m.w = __fn->w;
    m.h = __fn->h;
    m.c = __fn->elempack * __fn->c;
    m.elemsize = 4;
    m.dims = 3;
    m.cstep = (long)m.h * (long)m.w + 3U & 0x3ffffffffffffffc;
    m.d = m.elempack;
    goto LAB_0052f590;
  case 4:
    m.w = __fn->w;
    m.h = __fn->h;
    m.c = __fn->elempack * __fn->c;
    m.d = __fn->d;
    m.dims = 4;
    m.cstep = (long)m.h * (long)m.w * (long)m.d + 3U & 0x3ffffffffffffffc;
    break;
  default:
    m.cstep = 0;
    m.elemsize = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
    goto LAB_0052f590;
  }
  m.elempack = 1;
  m.elemsize = 4;
LAB_0052f590:
  m.allocator = (Allocator *)0x0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.data = (void *)0x0;
  resolve_copyto_offset(this,&m,&_woffset,&_hoffset,&_doffset,&_coffset);
  piVar9 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        free(m.data);
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  switch(iVar5) {
  case 1:
    if (sVar6 == 4) {
      _hoffset = 0;
LAB_0052f9e1:
      copy_to_image<float>(src,self,_hoffset,_woffset);
      return 0;
    }
    if (sVar6 == 2) {
      _hoffset = 0;
LAB_0052f9be:
      copy_to_image<unsigned_short>(src,self,_hoffset,_woffset);
      return 0;
    }
    if (sVar6 != 1) {
      return 0;
    }
    _hoffset = 0;
    goto LAB_0052f99b;
  case 2:
    if (sVar6 == 4) goto LAB_0052f9e1;
    if (sVar6 == 2) goto LAB_0052f9be;
    if (sVar6 != 1) {
      return 0;
    }
LAB_0052f99b:
    copy_to_image<signed_char>(src,self,_hoffset,_woffset);
    break;
  case 3:
    for (lVar10 = 0; lVar10 < __fn[1].c; lVar10 = lVar10 + 1) {
      m.w = __fn[1].w;
      m.h = __fn[1].h;
      m.elemsize = __fn[1].elemsize;
      m.data = (void *)(__fn[1].cstep * lVar10 * m.elemsize + (long)__fn[1].data);
      m.c = __fn[1].d;
      m.elempack = __fn[1].elempack;
      m.allocator = __fn[1].allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.d = 1;
      m.dims = __fn[1].dims + -1;
      m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
      if (__fn[1].dims == 4) {
        m.cstep = (long)m.h * (long)m.w;
      }
      m_1.w = self->w;
      m_1.h = self->h;
      m_1.elemsize = self->elemsize;
      m_1.data = (void *)((long)((int)lVar10 + _coffset) * self->cstep * m_1.elemsize +
                         (long)self->data);
      m_1.elempack = self->elempack;
      m_1.allocator = self->allocator;
      m_1.refcount = (int *)0x0;
      m_1.c = self->d;
      m_1.d = 1;
      m_1.dims = self->dims + -1;
      m_1.cstep = (m_1.elemsize * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) /
                  m_1.elemsize;
      if (self->dims == 4) {
        m_1.cstep = (long)m_1.h * (long)m_1.w;
      }
      if (sVar6 == 4) {
        copy_to_image<float>(&m,&m_1,_hoffset,_woffset);
      }
      else if (sVar6 == 2) {
        copy_to_image<unsigned_short>(&m,&m_1,_hoffset,_woffset);
      }
      else if (sVar6 == 1) {
        copy_to_image<signed_char>(&m,&m_1,_hoffset,_woffset);
      }
    }
    break;
  case 4:
    for (lVar10 = 0; lVar10 < __fn[1].c; lVar10 = lVar10 + 1) {
      for (lVar11 = 0; lVar11 < __fn[1].d; lVar11 = lVar11 + 1) {
        m.w = __fn[1].w;
        m.h = __fn[1].h;
        m.elemsize = __fn[1].elemsize;
        m.elempack = __fn[1].elempack;
        m.cstep = (long)m.h * (long)m.w;
        m.data = (void *)((long)__fn[1].data +
                         lVar11 * m.elemsize * m.cstep + __fn[1].cstep * lVar10 * m.elemsize);
        m.allocator = __fn[1].allocator;
        m.refcount._0_4_ = 0;
        m.refcount._4_4_ = 0;
        m.dims = 2;
        m.d = 1;
        m.c = 1;
        m_1.w = self->w;
        m_1.elemsize = self->elemsize;
        m_1.h = self->h;
        m_1.elempack = self->elempack;
        m_1.cstep = (long)m_1.h * (long)m_1.w;
        m_1.data = (void *)((long)self->data +
                           (long)(_doffset + (int)lVar11) * m_1.elemsize * m_1.cstep +
                           ((long)_coffset + (long)(int)lVar10) * self->cstep * m_1.elemsize);
        m_1.allocator = self->allocator;
        m_1.refcount = (int *)0x0;
        m_1.d = 1;
        m_1.c = 1;
        m_1.dims = m.dims;
        if (sVar6 == 4) {
          copy_to_image<float>(&m,&m_1,_hoffset,_woffset);
        }
        else if (sVar6 == 2) {
          copy_to_image<unsigned_short>(&m,&m_1,_hoffset,_woffset);
        }
        else if (sVar6 == 1) {
          copy_to_image<signed_char>(&m,&m_1,_hoffset,_woffset);
        }
      }
    }
  }
  return 0;
}

Assistant:

int CopyTo::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& self_blob = bottom_blobs[0];
    const Mat& src_blob = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = self_blob.w;
    int h = self_blob.h;
    int d = self_blob.d;
    int channels = self_blob.c;
    int dims = self_blob.dims;
    size_t elemsize = self_blob.elemsize;

    if (src_blob.dims == dims && src_blob.w == w && src_blob.h == h && src_blob.d == d && src_blob.c == channels)
    {
        top_blob = src_blob;
        return 0;
    }

    top_blob = self_blob.clone(opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    int _woffset, _hoffset, _doffset, _coffset;
    resolve_copyto_offset(self_blob.shape(), _woffset, _hoffset, _doffset, _coffset);

    if (dims == 1)
    {
        if (elemsize == 1)
            copy_to_image<signed char>(src_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_to_image<unsigned short>(src_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_to_image<float>(src_blob, top_blob, 0, _woffset);
    }

    if (dims == 2)
    {
        if (elemsize == 1)
            copy_to_image<signed char>(src_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_to_image<unsigned short>(src_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_to_image<float>(src_blob, top_blob, _hoffset, _woffset);
    }

    if (dims == 3)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < src_blob.c; q++)
        {
            const Mat roim = src_blob.channel(q);
            Mat m = top_blob.channel(q + _coffset);

            if (elemsize == 1)
                copy_to_image<signed char>(roim, m, _hoffset, _woffset);
            if (elemsize == 2)
                copy_to_image<unsigned short>(roim, m, _hoffset, _woffset);
            if (elemsize == 4)
                copy_to_image<float>(roim, m, _hoffset, _woffset);
        }
    }

    if (dims == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < src_blob.c; q++)
        {
            for (int z = 0; z < src_blob.d; z++)
            {
                const Mat roim = src_blob.channel(q).depth(z);
                Mat m = top_blob.channel(q + _coffset).depth(z + _doffset);

                if (elemsize == 1)
                    copy_to_image<signed char>(roim, m, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_to_image<unsigned short>(roim, m, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_to_image<float>(roim, m, _hoffset, _woffset);
            }
        }
    }

    return 0;
}